

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionHandler.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGL3ExtensionHandler::extensionsLoaded(COpenGL3ExtensionHandler *this)

{
  bool bVar1;
  Printer *pPVar2;
  COGLESCoreExtensionHandler *in_RDI;
  double __x;
  double __x_00;
  size_t j;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *it;
  iterator __end2;
  iterator __begin2;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  COpenGL3ExtensionHandler *in_stack_fffffffffffffee0;
  unsigned_long in_stack_fffffffffffffee8;
  allocator<char> *in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_f0 [32];
  string local_d0 [32];
  reference local_b0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a0;
  COGLESCoreExtensionHandler *local_98;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [32];
  string local_48 [32];
  string local_28 [40];
  
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x36ae33);
  ::std::__cxx11::to_string(in_stack_fffffffffffffee8);
  ::std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  ::std::operator+(in_stack_fffffffffffffed8,(char *)in_RDI);
  pPVar2 = (Printer *)::std::__cxx11::string::c_str();
  os::Printer::log(pPVar2,__x);
  ::std::__cxx11::string::~string(local_28);
  ::std::__cxx11::string::~string(local_48);
  ::std::__cxx11::string::~string(local_90);
  ::std::__cxx11::string::~string(local_68);
  ::std::allocator<char>::~allocator(&local_69);
  local_98 = in_RDI + 1;
  local_a0._M_cur =
       (__node_type *)
       ::std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(in_stack_fffffffffffffec8);
  local_a8._M_cur =
       (__node_type *)
       ::std::
       unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(in_stack_fffffffffffffec8);
  while( true ) {
    bVar1 = ::std::__detail::operator!=(&local_a0,&local_a8);
    if (!bVar1) break;
    local_b0 = ::std::__detail::
               _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
               ::operator*((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                            *)0x36af3a);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    ::std::operator+(in_stack_fffffffffffffed8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    pPVar2 = (Printer *)::std::__cxx11::string::c_str();
    os::Printer::log(pPVar2,__x_00);
    ::std::__cxx11::string::~string(local_d0);
    ::std::__cxx11::string::~string(local_f0);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff0f);
    ::std::__detail::
    _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
    ::operator++((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                  *)in_RDI);
  }
  for (this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      this_00 < (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1b;
      this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &this_00->field_0x1) {
    COGLESCoreExtensionHandler::getFeatureString(in_RDI,(size_t)this_00);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              (this_00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    bVar1 = queryExtension(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    in_RDI->FeatureAvailable[(long)this_00] = bVar1;
    ::std::__cxx11::string::~string((string *)&stack0xfffffffffffffee0);
    ::std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffedf);
  }
  return;
}

Assistant:

void COpenGL3ExtensionHandler::extensionsLoaded()
{
	os::Printer::log((std::string("Loaded ") + std::to_string(Extensions.size()) + " extensions:").c_str(), ELL_DEBUG);
	for (const auto &it : Extensions)
		os::Printer::log((std::string("  ") + it).c_str(), ELL_DEBUG);
	for (size_t j = 0; j < IRR_OGLES_Feature_Count; ++j)
		FeatureAvailable[j] = queryExtension(getFeatureString(j));
}